

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O0

point __thiscall tetgenmesh::farsdest(tetgenmesh *this,face *s)

{
  point pdVar1;
  point pdVar2;
  undefined1 local_38 [8];
  face neighsh;
  face travesh;
  face *s_local;
  tetgenmesh *this_local;
  
  face::face((face *)&neighsh.shver);
  face::face((face *)local_38);
  face::operator=((face *)&neighsh.shver,s);
  while( true ) {
    senext(this,(face *)&neighsh.shver,(face *)local_38);
    spivotself(this,(face *)local_38);
    if (local_38 == (undefined1  [8])0x0) break;
    pdVar2 = sdest(this,(face *)local_38);
    pdVar1 = sdest(this,(face *)&neighsh.shver);
    if (pdVar2 != pdVar1) {
      sesymself(this,(face *)local_38);
    }
    senext(this,(face *)local_38,(face *)&neighsh.shver);
  }
  pdVar2 = sdest(this,(face *)&neighsh.shver);
  return pdVar2;
}

Assistant:

inline tetgenmesh::point tetgenmesh::farsdest(face& s) 
{
  face travesh, neighsh;

  travesh = s;
  while (1) {
    senext(travesh, neighsh);
    spivotself(neighsh); 
    if (neighsh.sh == NULL) break;
    if (sdest(neighsh) != sdest(travesh)) sesymself(neighsh);
    senext(neighsh, travesh); 
  }
  return sdest(travesh);
}